

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O2

void printIncDec(_Bool isPost,SStream *O,m680x_info *info,cs_m680x_op *op)

{
  char cVar1;
  char (*fmt) [3];
  
  cVar1 = (op->field_1).idx.inc_dec;
  if (((long)cVar1 != 0) && ((((op->field_1).idx.flags & 4) == 0) != isPost)) {
    if (info->cpu_type == M680X_CPU_TYPE_CPU12) {
      fmt = (char (*) [3])0x51b373;
      if (cVar1 < '\0') {
        fmt = (char (*) [3])0x2cd6ad;
      }
    }
    else if ((byte)(cVar1 + 2U) < 5) {
      fmt = printIncDec::s_inc_dec + (long)cVar1 + 2;
    }
    else {
      fmt = (char (*) [3])(anon_var_dwarf_353f69 + 0x11);
    }
    SStream_concat(O,*fmt);
    return;
  }
  return;
}

Assistant:

static void printIncDec(bool isPost, SStream *O, m680x_info *info,
	cs_m680x_op *op)
{
	static const char s_inc_dec[][3] = { "--", "-", "", "+", "++" };

	if (!op->idx.inc_dec)
		return;

	if ((!isPost && !(op->idx.flags & M680X_IDX_POST_INC_DEC)) ||
		(isPost && (op->idx.flags & M680X_IDX_POST_INC_DEC))) {
		const char *prePostfix = "";

		if (info->cpu_type == M680X_CPU_TYPE_CPU12)
			prePostfix = (op->idx.inc_dec < 0) ? "-" : "+";
		else if (op->idx.inc_dec >= -2 && (op->idx.inc_dec <= 2)) {
			prePostfix = (char *)s_inc_dec[op->idx.inc_dec + 2];
		}

		SStream_concat(O, prePostfix);
	}
}